

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

bool __thiscall
re2::Regexp::RequiredPrefix(Regexp *this,string *prefix,bool *foldcase,Regexp **suffix)

{
  ParseFlags PVar1;
  int iVar2;
  undefined1 *puVar3;
  Regexp *pRVar4;
  undefined8 *in_RCX;
  undefined1 *in_RDX;
  char *in_RSI;
  Regexp *in_RDI;
  bool bVar5;
  int j_2;
  char buf [4];
  Rune r;
  int j_1;
  char *p;
  int j;
  Regexp *re;
  Regexp **sub;
  int i;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  int local_60;
  char local_5c [4];
  int local_58;
  int local_54;
  char *local_50;
  int local_44;
  Regexp *local_40;
  Regexp **local_38;
  int local_2c;
  undefined8 *local_28;
  undefined1 *local_20;
  char *local_18;
  bool local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::__cxx11::string::clear();
  *local_20 = 0;
  *local_28 = 0;
  if (in_RDI->op_ == '\x05') {
    local_2c = 0;
    local_38 = Regexp::sub(in_RDI);
    while( true ) {
      bVar5 = false;
      if (local_2c < (int)(uint)in_RDI->nsub_) {
        bVar5 = local_38[local_2c]->op_ == '\x12';
      }
      if (!bVar5) break;
      local_2c = local_2c + 1;
    }
    if ((local_2c == 0) || ((int)(uint)in_RDI->nsub_ <= local_2c)) {
      local_1 = false;
    }
    else {
      local_40 = local_38[local_2c];
      if (local_40->op_ == '\x03') {
        PVar1 = parse_flags(local_40);
        PVar1 = operator&(PVar1,Latin1);
        if ((PVar1 == NoParseFlags) && (0x7f < (local_40->field_7).field_0.max_)) {
          runetochar(local_5c,&(local_40->field_7).rune_);
          std::__cxx11::string::append(local_18,(ulong)local_5c);
        }
        else {
          std::__cxx11::string::append((ulong)local_18,'\x01');
        }
      }
      else {
        if (local_40->op_ != '\x04') {
          return false;
        }
        PVar1 = parse_flags(local_40);
        PVar1 = operator&(PVar1,Latin1);
        if (PVar1 == NoParseFlags) {
          std::__cxx11::string::resize((ulong)local_18);
          local_50 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
          for (local_54 = 0; local_54 < (local_40->field_7).field_0.max_; local_54 = local_54 + 1) {
            local_58 = *(int *)(&((local_40->field_7).field_1.name_)->_M_dataplus +
                               (long)local_54 * 4);
            if (local_58 < 0x80) {
              *local_50 = (char)local_58;
              local_50 = local_50 + 1;
            }
            else {
              iVar2 = runetochar(local_50,&local_58);
              local_50 = local_50 + iVar2;
            }
          }
          std::__cxx11::string::operator[]((ulong)local_18);
          std::__cxx11::string::resize((ulong)local_18);
        }
        else {
          std::__cxx11::string::resize((ulong)local_18);
          for (local_44 = 0; local_44 < (local_40->field_7).field_0.max_; local_44 = local_44 + 1) {
            in_stack_ffffffffffffff7f =
                 (undefined1)
                 *(undefined4 *)
                  (&((local_40->field_7).field_1.name_)->_M_dataplus + (long)local_44 * 4);
            puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_18);
            *puVar3 = in_stack_ffffffffffffff7f;
          }
        }
      }
      PVar1 = parse_flags(local_38[local_2c]);
      PVar1 = operator&(PVar1,FoldCase);
      *local_20 = PVar1 != NoParseFlags;
      local_60 = local_2c + 1;
      local_2c = local_60;
      if (local_60 < (int)(uint)in_RDI->nsub_) {
        for (; local_60 < (int)(uint)in_RDI->nsub_; local_60 = local_60 + 1) {
          Incref((Regexp *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
        }
        parse_flags(in_RDI);
        local_40 = Concat((Regexp **)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                          (ParseFlags)in_stack_ffffffffffffff38);
      }
      else {
        pRVar4 = (Regexp *)operator_new(0x28);
        PVar1 = parse_flags(in_RDI);
        Regexp((Regexp *)CONCAT44(PVar1,in_stack_ffffffffffffff40),(RegexpOp)((ulong)pRVar4 >> 0x20)
               ,(ParseFlags)pRVar4);
        local_40 = pRVar4;
      }
      *local_28 = local_40;
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Regexp::RequiredPrefix(std::string* prefix, bool* foldcase,
                            Regexp** suffix) {
  // No need for a walker: the regexp must be of the form
  // 1. some number of ^ anchors
  // 2. a literal char or string
  // 3. the rest
  prefix->clear();
  *foldcase = false;
  *suffix = NULL;
  if (op_ != kRegexpConcat)
    return false;

  // Some number of anchors, then a literal or concatenation.
  int i = 0;
  Regexp** sub = this->sub();
  while (i < nsub_ && sub[i]->op_ == kRegexpBeginText)
    i++;
  if (i == 0 || i >= nsub_)
    return false;

  Regexp* re = sub[i];
  switch (re->op_) {
    default:
      return false;

    case kRegexpLiteralString:
      // Convert to string in proper encoding.
      if (re->parse_flags() & Latin1) {
        prefix->resize(re->nrunes_);
        for (int j = 0; j < re->nrunes_; j++)
          (*prefix)[j] = static_cast<char>(re->runes_[j]);
      } else {
        // Convert to UTF-8 in place.
        // Assume worst-case space and then trim.
        prefix->resize(re->nrunes_ * UTFmax);
        char *p = &(*prefix)[0];
        for (int j = 0; j < re->nrunes_; j++) {
          Rune r = re->runes_[j];
          if (r < Runeself)
            *p++ = static_cast<char>(r);
          else
            p += runetochar(p, &r);
        }
        prefix->resize(p - &(*prefix)[0]);
      }
      break;

    case kRegexpLiteral:
      if ((re->parse_flags() & Latin1) || re->rune_ < Runeself) {
        prefix->append(1, static_cast<char>(re->rune_));
      } else {
        char buf[UTFmax];
        prefix->append(buf, runetochar(buf, &re->rune_));
      }
      break;
  }
  *foldcase = (sub[i]->parse_flags() & FoldCase) != 0;
  i++;

  // The rest.
  if (i < nsub_) {
    for (int j = i; j < nsub_; j++)
      sub[j]->Incref();
    re = Concat(sub + i, nsub_ - i, parse_flags());
  } else {
    re = new Regexp(kRegexpEmptyMatch, parse_flags());
  }
  *suffix = re;
  return true;
}